

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

string * __thiscall
flatbuffers::go::GoGenerator::CastToEnum
          (string *__return_storage_ptr__,GoGenerator *this,Type *type,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (type->enum_def == (EnumDef *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  }
  else {
    GenTypeGet_abi_cxx11_(&local_38,this,type);
    std::operator+(&bStack_78,&local_38,"(");
    std::operator+(&local_58,&bStack_78,value);
    std::operator+(__return_storage_ptr__,&local_58,")");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CastToEnum(const Type &type, std::string value) {
    if (type.enum_def == nullptr) {
      return value;
    } else {
      return GenTypeGet(type) + "(" + value + ")";
    }
  }